

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_file_time(archive *_a,wchar_t flag,char *pathname)

{
  wchar_t r;
  char *pathname_local;
  wchar_t flag_local;
  archive *_a_local;
  
  _a_local._4_4_ = validate_time_flag(_a,flag,"archive_match_include_file_time");
  if (_a_local._4_4_ == L'\0') {
    _a_local._4_4_ = set_timefilter_pathname_mbs((archive_match *)_a,flag,pathname);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_include_file_time(struct archive *_a, int flag,
    const char *pathname)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_file_time");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_pathname_mbs((struct archive_match *)_a,
			flag, pathname);
}